

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

char * ssh2_pubkey_openssh_str_internal(char *comment,void *v_pub_blob,int pub_len)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  int iVar4;
  char *pcVar5;
  size_t s;
  bool bVar6;
  ptrlen pVar7;
  BinarySource src [1];
  BinarySource local_58;
  
  local_58.len = (size_t)pub_len;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.data = v_pub_blob;
  pVar7 = BinarySource_get_string(local_58.binarysource_);
  bVar6 = (local_58.binarysource_)->err == BSE_NO_ERROR;
  pcVar5 = "INVALID-ALGORITHM";
  if (bVar6) {
    pcVar5 = (char *)pVar7.ptr;
  }
  s = 0x11;
  if (bVar6) {
    s = pVar7.len;
  }
  if (comment == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(comment);
  }
  iVar4 = 0;
  __s = (char *)safemalloc((long)(int)(((pub_len + 2) / 3) * 4 | 3) + sVar3 + s,1,0);
  uVar1 = string_length_for_printf(s);
  iVar2 = sprintf(__s,"%.*s ",(ulong)uVar1,pcVar5);
  pcVar5 = __s + iVar2;
  if (0 < pub_len) {
    do {
      iVar2 = pub_len - iVar4;
      if (2 < iVar2) {
        iVar2 = 3;
      }
      base64_encode_atom((uchar *)((long)v_pub_blob + (long)iVar4),iVar2,pcVar5);
      iVar4 = iVar4 + iVar2;
      pcVar5 = pcVar5 + 4;
    } while (iVar4 < pub_len);
  }
  if (comment == (char *)0x0) {
    *pcVar5 = '\0';
  }
  else {
    *pcVar5 = ' ';
    strcpy(pcVar5 + 1,comment);
  }
  return __s;
}

Assistant:

static char *ssh2_pubkey_openssh_str_internal(const char *comment,
                                              const void *v_pub_blob,
                                              int pub_len)
{
    const unsigned char *ssh2blob = (const unsigned char *)v_pub_blob;
    ptrlen alg;
    char *buffer, *p;
    int i;

    {
        BinarySource src[1];
        BinarySource_BARE_INIT(src, ssh2blob, pub_len);
        alg = get_string(src);
        if (get_err(src)) {
            const char *replacement_str = "INVALID-ALGORITHM";
            alg.ptr = replacement_str;
            alg.len = strlen(replacement_str);
        }
    }

    buffer = snewn(alg.len +
                   4 * ((pub_len+2) / 3) +
                   (comment ? strlen(comment) : 0) + 3, char);
    p = buffer + sprintf(buffer, "%.*s ", PTRLEN_PRINTF(alg));
    i = 0;
    while (i < pub_len) {
        int n = (pub_len - i < 3 ? pub_len - i : 3);
        base64_encode_atom(ssh2blob + i, n, p);
        i += n;
        p += 4;
    }
    if (comment) {
        *p++ = ' ';
        strcpy(p, comment);
    } else
        *p++ = '\0';

    return buffer;
}